

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo,int iCons)

{
  long lVar1;
  CollSeq *local_48;
  Expr *pX;
  CollSeq *pCStack_30;
  int iTerm;
  CollSeq *pC;
  char *zRet;
  HiddenIndexInfo *pHidden;
  int iCons_local;
  sqlite3_index_info *pIdxInfo_local;
  
  pC = (CollSeq *)0x0;
  if ((-1 < iCons) && (iCons < pIdxInfo->nConstraint)) {
    pCStack_30 = (CollSeq *)0x0;
    lVar1 = *(long *)(*(long *)(*(long *)(pIdxInfo + 1) + 0x20) +
                     (long)pIdxInfo->aConstraint[iCons].iTermOffset * 0x40);
    if (*(long *)(lVar1 + 0x10) != 0) {
      pCStack_30 = sqlite3BinaryCompareCollSeq
                             ((Parse *)pIdxInfo[1].aConstraint,*(Expr **)(lVar1 + 0x10),
                              *(Expr **)(lVar1 + 0x18));
    }
    if (pCStack_30 == (CollSeq *)0x0) {
      local_48 = (CollSeq *)0x2270c5;
    }
    else {
      local_48 = (CollSeq *)pCStack_30->zName;
    }
    pC = local_48;
  }
  return (char *)pC;
}

Assistant:

SQLITE_API const char *sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo, int iCons){
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  const char *zRet = 0;
  if( iCons>=0 && iCons<pIdxInfo->nConstraint ){
    CollSeq *pC = 0;
    int iTerm = pIdxInfo->aConstraint[iCons].iTermOffset;
    Expr *pX = pHidden->pWC->a[iTerm].pExpr;
    if( pX->pLeft ){
      pC = sqlite3BinaryCompareCollSeq(pHidden->pParse, pX->pLeft, pX->pRight);
    }
    zRet = (pC ? pC->zName : sqlite3StrBINARY);
  }
  return zRet;
}